

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::detail::
dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
          (detail *this,
          __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
          begin,__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                *end,Function_Params *plist,Type_Conversions_State *t_conversions,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar4;
  dispatch_error *pdVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Proxy_Function_Base **t_func;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar6;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar7;
  Boxed_Value BVar8;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> newplist;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_a8;
  element_type *local_90;
  Type_Conversions_State local_70;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_60;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_48;
  
  ppVar4 = end->_M_current;
  ppVar7 = ppVar4;
  local_90 = (element_type *)this;
  if (ppVar4 != begin._M_current) {
    t_func = &(begin._M_current)->second;
    do {
      bVar3 = types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
                        (t_func,plist,t_conversions);
      ppVar4 = ppVar7;
      if ((bVar3) &&
         (ppVar4 = (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)
                   (t_func + -1), ppVar7 != end->_M_current)) {
        uVar1 = (((plist->m_begin->m_data).
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_type_info).m_flags;
        if ((uVar1 & 1) != 0) {
          if ((((ppVar7->second->m_types).
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_start[1].m_flags & 1) == 0) &&
             ((((*t_func)->m_types).
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_start[1].m_flags & 1) != 0)) goto LAB_002b6b03;
          if ((uVar1 & 1) != 0) goto LAB_002b6bc2;
        }
        if ((((ppVar7->second->m_types).
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
              _M_impl.super__Vector_impl_data._M_start[1].m_flags & 1) != 0) ||
           (ppVar4 = ppVar7,
           (((*t_func)->m_types).
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start[1].m_flags & 1) == 0)) {
LAB_002b6bc2:
          pdVar5 = (dispatch_error *)__cxa_allocate_exception(0x40);
          std::
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
          ::
          vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,void>
                    ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                      *)&local_48,
                     (t_funcs->
                     super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (t_funcs->
                     super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_a8);
          exception::dispatch_error::dispatch_error(pdVar5,plist,&local_48);
          __cxa_throw(pdVar5,&exception::dispatch_error::typeinfo,
                      exception::dispatch_error::~dispatch_error);
        }
      }
LAB_002b6b03:
      ppVar7 = ppVar4;
      ppVar4 = end->_M_current;
      ppVar6 = (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)
               (t_func + 1);
      t_func = t_func + 2;
    } while (ppVar6 != ppVar4);
  }
  if (ppVar7 == ppVar4) {
    pdVar5 = (dispatch_error *)__cxa_allocate_exception(0x40);
    std::
    vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,void>
              ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                *)&local_60,
               (t_funcs->
               super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (t_funcs->
               super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_a8);
    exception::dispatch_error::dispatch_error(pdVar5,plist,&local_60);
    __cxa_throw(pdVar5,&exception::dispatch_error::typeinfo,
                exception::dispatch_error::~dispatch_error);
  }
  local_a8.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
            (&local_a8,(long)plist->m_end - (long)plist->m_begin >> 4);
  std::
  transform<__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,chaiscript::Boxed_Value_const*,std::back_insert_iterator<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,chaiscript::dispatch::detail::dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>(__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>const&,chaiscript::Function_Params_const&,chaiscript::Type_Conversions_State_const&,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>const&)::_lambda(chaiscript::Type_Info_const&,chaiscript::Boxed_Value_const&)_1_>
            ((ppVar7->second->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,
             (ppVar7->second->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_finish,plist->m_begin,&local_a8);
  peVar2 = local_90;
  local_70.m_conversions._M_data =
       (Type_Conversions *)
       local_a8.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_start;
  if (local_a8.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a8.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_70.m_conversions._M_data = (Type_Conversions *)0x0;
  }
  local_70.m_saves._M_data =
       (Conversion_Saves *)
       local_a8.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (local_a8.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a8.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_70.m_saves._M_data = (Conversion_Saves *)(Type_Conversions *)0x0;
  }
  Proxy_Function_Base::operator()
            ((Proxy_Function_Base *)local_90,(Function_Params *)ppVar7->second,&local_70);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_a8)
  ;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value dispatch_with_conversions(InItr begin,
                                            const InItr &end,
                                            const chaiscript::Function_Params &plist,
                                            const Type_Conversions_State &t_conversions,
                                            const Funcs &t_funcs) {
        InItr matching_func(end);

        while (begin != end) {
          if (types_match_except_for_arithmetic(begin->second, plist, t_conversions)) {
            if (matching_func == end) {
              matching_func = begin;
            } else {
              // handle const members vs non-const member, which is not really ambiguous
              const auto &mat_fun_param_types = matching_func->second->get_param_types();
              const auto &next_fun_param_types = begin->second->get_param_types();

              if (plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                matching_func = begin; // keep the new one, the const/non-const matchup is correct
              } else if (!plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                // keep the old one, it has a better const/non-const matchup
              } else {
                // ambiguous function call
                throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
              }
            }
          }

          ++begin;
        }

        if (matching_func == end) {
          // no appropriate function to attempt arithmetic type conversion on
          throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
        }

        std::vector<Boxed_Value> newplist;
        newplist.reserve(plist.size());

        const std::vector<Type_Info> &tis = matching_func->second->get_param_types();
        std::transform(tis.begin() + 1, tis.end(), plist.begin(), std::back_inserter(newplist), [](const Type_Info &ti, const Boxed_Value &param) -> Boxed_Value {
          if (ti.is_arithmetic() && param.get_type_info().is_arithmetic() && param.get_type_info() != ti) {
            return Boxed_Number(param).get_as(ti).bv;
          } else {
            return param;
          }
        });

        try {
          return (*(matching_func->second))(chaiscript::Function_Params{newplist}, t_conversions);
        } catch (const exception::bad_boxed_cast &) {
          // parameter failed to cast
        } catch (const exception::arity_error &) {
          // invalid num params
        } catch (const exception::guard_error &) {
          // guard failed to allow the function to execute
        }

        throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
      }